

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void * __thiscall
google::protobuf::Reflection::GetRawRepeatedField
          (Reflection *this,Message *message,FieldDescriptor *field,CppType cpptype,int ctype,
          Descriptor *desc)

{
  bool bVar1;
  uint32_t uVar2;
  Nullable<const_char_*> failure_msg;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar3;
  char *description;
  char *method;
  Descriptor *descriptor;
  LogMessage local_48;
  Descriptor *local_38;
  
  local_38 = desc;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    descriptor = this->descriptor_;
    method = "\"GetRawRepeatedField\"";
    description = "Field is singular; the method requires a repeated field.";
LAB_00c6fd09:
    anon_unknown_6::ReportReflectionUsageError(descriptor,field,method,description);
  }
  descriptor = this->descriptor_;
  if (field->containing_type_ != descriptor) {
    method = "GetRawRepeatedField";
    description = "Field does not match message type.";
    goto LAB_00c6fd09;
  }
  if ((*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != cpptype) &&
     ((cpptype != CPPTYPE_INT32 ||
      (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != CPPTYPE_ENUM)))
     ) {
    anon_unknown_6::ReportReflectionUsageTypeError(descriptor,field,"GetRawRepeatedField",cpptype);
  }
  if (-1 < ctype) {
    bVar1 = internal::IsMatchingCType(field,ctype);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xae2,"IsMatchingCType(field, ctype)");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_48,(char (*) [17])"subtype mismatch");
      goto LAB_00c6fd25;
    }
  }
  if (desc != (Descriptor *)0x0) {
    local_48._0_8_ = FieldDescriptor::message_type(field);
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                            ((Descriptor **)&local_48,&local_38,"field->message_type() == desc");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0xae4,failure_msg);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_48,(char (*) [22])"wrong submessage type");
LAB_00c6fd25:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_48);
    }
  }
  if ((field->field_0x1 & 8) == 0) {
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) {
      this_00 = GetRawNonOneof<google::protobuf::internal::MapFieldBase>(this,message,field);
      pRVar3 = internal::MapFieldBase::GetRepeatedField(this_00);
    }
    else {
      pRVar3 = (RepeatedPtrFieldBase *)GetRawNonOneof<char>(this,message,field);
    }
  }
  else {
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pRVar3 = (RepeatedPtrFieldBase *)
             internal::ExtensionSet::GetRawRepeatedField
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                        field->number_,&internal::kZeroBuffer);
  }
  return pRVar3;
}

Assistant:

const void* Reflection::GetRawRepeatedField(const Message& message,
                                            const FieldDescriptor* field,
                                            FieldDescriptor::CppType cpptype,
                                            int ctype,
                                            const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("GetRawRepeatedField");
  USAGE_CHECK_MESSAGE_TYPE(GetRawRepeatedField);
  if (field->cpp_type() != cpptype &&
      (field->cpp_type() != FieldDescriptor::CPPTYPE_ENUM ||
       cpptype != FieldDescriptor::CPPTYPE_INT32))
    ReportReflectionUsageTypeError(descriptor_, field, "GetRawRepeatedField",
                                   cpptype);
  if (ctype >= 0)
    ABSL_CHECK(IsMatchingCType(field, ctype)) << "subtype mismatch";
  if (desc != nullptr)
    ABSL_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRawRepeatedField(
        field->number(), internal::DefaultRawPtr());
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return &(GetRawNonOneof<MapFieldBase>(message, field).GetRepeatedField());
    }
    return &GetRawNonOneof<char>(message, field);
  }
}